

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

bStream * bsopen(bNread readPtr,void *parm)

{
  bstring ptVar1;
  bStream *s;
  void *parm_local;
  bNread readPtr_local;
  
  if (readPtr == (bNread)0x0) {
    readPtr_local = (bNread)0x0;
  }
  else {
    readPtr_local = (bNread)malloc(0x20);
    if (readPtr_local == (bNread)0x0) {
      readPtr_local = (bNread)0x0;
    }
    else {
      *(void **)(readPtr_local + 8) = parm;
      ptVar1 = bfromcstr("");
      *(bstring *)readPtr_local = ptVar1;
      *(bNread *)(readPtr_local + 0x10) = readPtr;
      *(undefined4 *)(readPtr_local + 0x1c) = 0x400;
      *(undefined4 *)(readPtr_local + 0x18) = 0;
    }
  }
  return (bStream *)readPtr_local;
}

Assistant:

struct bStream * bsopen (bNread readPtr, void * parm) {
struct bStream * s;

	if (readPtr == NULL) return NULL;
	s = (struct bStream *) bstr__alloc (sizeof (struct bStream));
	if (s == NULL) return NULL;
	s->parm = parm;
	s->buff = bfromcstr ("");
	s->readFnPtr = readPtr;
	s->maxBuffSz = BS_BUFF_SZ;
	s->isEOF = 0;
	return s;
}